

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::outedges(tetgenmesh *this,tetgenio *out)

{
  tetrahedron *pppdVar1;
  int iVar2;
  tetgenbehavior *ptVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  tetrahedron ppdVar6;
  point pdVar7;
  uint uVar8;
  bool bVar9;
  size_t sVar10;
  int *piVar11;
  long lVar12;
  tetrahedron *pppdVar13;
  tetrahedron *pppdVar14;
  FILE *pFVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  uint *puVar24;
  int *local_468;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  double *local_448;
  char edgefilename [1024];
  
  if (out == (tetgenio *)0x0) {
    strcpy(edgefilename,this->b->outfilename);
    sVar10 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar10,".edge",6);
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",edgefilename);
    }
    else {
      puts("Writing edges.");
    }
  }
  if (this->meshedges == 0) {
    if (this->nonconvex == 0) {
      uVar17 = this->tetrahedrons->items - this->hullsize;
      if (this->b->weighted == 0) {
        lVar12 = 0;
      }
      else {
        lVar12 = this->nonregularcount;
      }
      this->meshedges =
           (~uVar17 + this->points->items + (long)(this->hullsize + uVar17 * 4) / 2) -
           (this->dupverts + this->unuverts + lVar12);
    }
    else {
      numberedges(this);
    }
  }
  this->meshhulledges = 0;
  if (out == (tetgenio *)0x0) {
    pFVar15 = fopen(edgefilename,"w");
    if (pFVar15 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",edgefilename);
      puts("Error:  Out of memory.");
      exit(1);
    }
    fprintf(pFVar15,"%ld  %d\n",this->meshedges,(ulong)(this->b->nobound == 0));
  }
  else {
    uVar17 = this->meshedges;
    out->numberofedges = (int)uVar17;
    piVar11 = (int *)operator_new__(-(ulong)((uVar17 & 0x6000000000000000) != 0) | uVar17 * 8);
    out->edgelist = piVar11;
    ptVar3 = this->b;
    if (ptVar3->order == 2) {
      uVar20 = 0xffffffffffffffff;
      if (uVar17 < 0x4000000000000000) {
        uVar20 = uVar17 * 4;
      }
      piVar11 = (int *)operator_new__(uVar20);
      out->o2edgelist = piVar11;
    }
    if (ptVar3->nobound == 0) {
      uVar20 = 0xffffffffffffffff;
      if (uVar17 < 0x4000000000000000) {
        uVar20 = uVar17 * 4;
      }
      piVar11 = (int *)operator_new__(uVar20);
      out->edgemarkerlist = piVar11;
    }
    if (1 < ptVar3->neighout) {
      uVar20 = 0xffffffffffffffff;
      if (uVar17 < 0x4000000000000000) {
        uVar20 = uVar17 * 4;
      }
      piVar11 = (int *)operator_new__(uVar20);
      out->edge2tetlist = piVar11;
    }
    pFVar15 = (FILE *)0x0;
  }
  ptVar3 = this->b;
  if (ptVar3->neighout < 2) {
    local_468 = (int *)0x0;
  }
  else {
    lVar12 = this->tetrahedrons->items - this->hullsize;
    uVar17 = 0xffffffffffffffff;
    if ((ulong)(lVar12 * 6) < 0x4000000000000000) {
      uVar17 = lVar12 * 0x18;
    }
    local_468 = (int *)operator_new__(uVar17);
  }
  uVar17 = 0;
  if (ptVar3->zeroindex == 0) {
    uVar17 = (ulong)(uint)this->in->firstnumber;
  }
  pmVar4 = this->tetrahedrons;
  iVar23 = this->in->firstnumber;
  iVar19 = (int)uVar17;
  ppvVar5 = pmVar4->firstblock;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 +
               (((long)pmVar4->alignbytes + 8U) -
               (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  pppdVar13 = tetrahedrontraverse(this);
  if (pppdVar13 != (tetrahedron *)0x0) {
    uVar8 = (uint)(iVar23 == 1 && iVar19 == 0);
    local_44c = 0;
    local_458 = 0;
    local_450 = 0;
    local_454 = 0;
    local_448 = (double *)0x0;
    do {
      lVar12 = 0;
      do {
        iVar23 = edge2ver[lVar12];
        pppdVar14 = (tetrahedron *)((ulong)pppdVar13[facepivot1[iVar23]] & 0xfffffffffffffff0);
        piVar11 = facepivot2[iVar23] + ((uint)pppdVar13[facepivot1[iVar23]] & 0xf);
        bVar9 = false;
        do {
          if (pppdVar14[7] == (tetrahedron)this->dummypoint) {
            bVar9 = true;
          }
          else if (*(int *)(pppdVar14 + 10) < *(int *)(pppdVar13 + 10)) break;
          pppdVar1 = pppdVar14 + facepivot1[*piVar11];
          pppdVar14 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          piVar11 = facepivot2[*piVar11] + ((uint)*pppdVar1 & 0xf);
        } while (pppdVar13 != pppdVar14);
        if (pppdVar14 == pppdVar13) {
          if (bVar9) {
            this->meshhulledges = this->meshhulledges + 1;
          }
          ppdVar6 = pppdVar13[destpivot[iVar23]];
          ptVar3 = this->b;
          if (ptVar3->order == 2) {
            local_448 = pppdVar13[0xb][ver2edge[iVar23]];
          }
          if (out == (tetgenio *)0x0) {
            fprintf(pFVar15,"%5d   %4d  %4d",uVar17,
                    (ulong)(*(int *)((long)pppdVar13[orgpivot[iVar23]] +
                                    (long)this->pointmarkindex * 4) - uVar8),
                    (ulong)(*(int *)((long)ppdVar6 + (long)this->pointmarkindex * 4) - uVar8));
            if (this->b->order == 2) {
              fprintf(pFVar15,"  %4d",
                      (ulong)(*(int *)((long)local_448 + (long)this->pointmarkindex * 4) - uVar8));
            }
          }
          else {
            piVar11 = out->edgelist;
            lVar21 = (long)local_44c;
            piVar11[lVar21] =
                 *(int *)((long)pppdVar13[orgpivot[iVar23]] + (long)this->pointmarkindex * 4) -
                 uVar8;
            local_44c = local_44c + 2;
            piVar11[lVar21 + 1] = *(int *)((long)ppdVar6 + (long)this->pointmarkindex * 4) - uVar8;
            if (ptVar3->order == 2) {
              lVar21 = (long)local_450;
              local_450 = local_450 + 1;
              out->o2edgelist[lVar21] =
                   *(int *)((long)local_448 + (long)this->pointmarkindex * 4) - uVar8;
            }
          }
          ptVar3 = this->b;
          if (ptVar3->nobound == 0) {
            if ((ptVar3->plc == 0) && (ptVar3->refine == 0)) {
              uVar16 = (uint)bVar9;
            }
            else {
              if (pppdVar13[8] == (tetrahedron)0x0) {
                uVar20 = 0;
              }
              else {
                uVar20 = (ulong)pppdVar13[8][ver2edge[iVar23]] & 0xfffffffffffffff8;
              }
              if (uVar20 == 0) {
                uVar16 = 0;
              }
              else {
                uVar16 = *(uint *)(uVar20 + (long)this->shmarkindex * 4);
              }
            }
            if (out == (tetgenio *)0x0) {
              fprintf(pFVar15,"  %d");
            }
            else {
              lVar21 = (long)local_458;
              local_458 = local_458 + 1;
              out->edgemarkerlist[lVar21] = uVar16;
            }
          }
          if (1 < this->b->neighout) {
            if (out == (tetgenio *)0x0) {
              fprintf(pFVar15,"  %d",(ulong)*(uint *)(pppdVar13 + 10));
            }
            else {
              lVar21 = (long)local_454;
              local_454 = local_454 + 1;
              out->edge2tetlist[lVar21] = *(int *)(pppdVar13 + 10);
            }
            ppdVar6 = (tetrahedron)this->dummypoint;
            pppdVar14 = pppdVar13;
            do {
              if (pppdVar14[7] != ppdVar6) {
                local_468[(long)ver2edge[iVar23] +
                          ((long)*(int *)(pppdVar14 + 10) - (long)iVar19) * 6] = (int)uVar17;
              }
              pppdVar1 = pppdVar14 + facepivot1[iVar23];
              pppdVar14 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
              iVar23 = facepivot2[iVar23][(uint)*pppdVar1 & 0xf];
            } while (pppdVar13 != pppdVar14);
          }
          if (out == (tetgenio *)0x0) {
            fputc(10,pFVar15);
          }
          uVar17 = (ulong)((int)uVar17 + 1);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 6);
      pppdVar13 = tetrahedrontraverse(this);
    } while (pppdVar13 != (tetrahedron *)0x0);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(pFVar15,"# Generated by %s\n",this->b->commandline);
    fclose(pFVar15);
  }
  if (1 < this->b->neighout) {
    pmVar4 = this->tetrahedrons;
    lVar12 = pmVar4->items - this->hullsize;
    if (this->b->facesout != 0) {
      lVar21 = this->hullsize + lVar12 * 4;
      lVar22 = lVar21 / 2;
      uVar17 = 0xffffffffffffffff;
      if ((ulong)(lVar22 * 3) < 0x4000000000000000) {
        uVar17 = lVar22 * 0xc;
      }
      piVar11 = (int *)operator_new__(uVar17);
      ppvVar5 = pmVar4->firstblock;
      pmVar4->pathblock = ppvVar5;
      iVar23 = 0;
      pmVar4->pathitem =
           (void *)((long)ppvVar5 +
                   (((long)pmVar4->alignbytes + 8U) -
                   (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
      pmVar4->pathitemsleft = pmVar4->itemsperblock;
      pppdVar13 = tetrahedrontraverse(this);
      while (pppdVar13 != (tetrahedron *)0x0) {
        pdVar7 = this->dummypoint;
        uVar17 = 0;
        do {
          if ((*(point *)(((ulong)pppdVar13[uVar17] & 0xfffffffffffffff0) + 0x38) == pdVar7) ||
             (*(int *)(pppdVar13 + 10) <
              *(int *)(((ulong)pppdVar13[uVar17] & 0xfffffffffffffff0) + 0x50))) {
            iVar2 = *(int *)(pppdVar13 + 10);
            lVar18 = 0;
            uVar20 = uVar17 & 0xffffffff;
            do {
              uVar20 = (ulong)enexttbl[(int)uVar20];
              piVar11[iVar23 * 3 + lVar18] =
                   local_468[(long)ver2edge[uVar20] + ((long)iVar2 - (long)iVar19) * 6];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            iVar23 = iVar23 + 1;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != 4);
        pppdVar13 = tetrahedrontraverse(this);
      }
      if (out == (tetgenio *)0x0) {
        strcpy(edgefilename,this->b->outfilename);
        sVar10 = strlen(edgefilename);
        builtin_strncpy(edgefilename + sVar10,".f2e",5);
      }
      if (this->b->quiet == 0) {
        if (out == (tetgenio *)0x0) {
          printf("Writing %s.\n",edgefilename);
        }
        else {
          puts("Writing face-to-edge map.");
        }
      }
      if (out == (tetgenio *)0x0) {
        pFVar15 = fopen(edgefilename,"w");
        if (1 < lVar21) {
          puVar24 = (uint *)(piVar11 + 2);
          lVar21 = 0;
          do {
            fprintf(pFVar15,"%4d  %d %d %d\n",(ulong)(uint)(this->in->firstnumber + (int)lVar21),
                    (ulong)puVar24[-2],(ulong)puVar24[-1],(ulong)*puVar24);
            lVar21 = lVar21 + 1;
            puVar24 = puVar24 + 3;
          } while (lVar22 != lVar21);
        }
        fclose(pFVar15);
        operator_delete__(piVar11);
      }
      else {
        out->face2edgelist = piVar11;
      }
    }
    if (out == (tetgenio *)0x0) {
      strcpy(edgefilename,this->b->outfilename);
      sVar10 = strlen(edgefilename);
      builtin_strncpy(edgefilename + sVar10,".t2e",5);
    }
    if (this->b->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",edgefilename);
      }
      else {
        puts("Writing tetrahedron-to-edge map.");
      }
    }
    if (out == (tetgenio *)0x0) {
      pFVar15 = fopen(edgefilename,"w");
      if (0 < lVar12) {
        puVar24 = (uint *)(local_468 + 5);
        lVar21 = 0;
        do {
          fprintf(pFVar15,"%4d  %d %d %d %d %d %d\n",
                  (ulong)(uint)(this->in->firstnumber + (int)lVar21),(ulong)puVar24[-5],
                  (ulong)puVar24[-4],(ulong)puVar24[-3],(ulong)puVar24[-2],(ulong)puVar24[-1],
                  (ulong)*puVar24);
          lVar21 = lVar21 + 1;
          puVar24 = puVar24 + 6;
        } while (lVar12 != lVar21);
      }
      fclose(pFVar15);
      if (local_468 != (int *)0x0) {
        operator_delete__(local_468);
      }
    }
    else {
      out->tet2edgelist = local_468;
    }
  }
  return;
}

Assistant:

void tetgenmesh::outedges(tetgenio* out)
{
  FILE *outfile = NULL;
  char edgefilename[FILENAMESIZE];
  triface tetloop, worktet, spintet;
  face checkseg;
  point torg, tdest;
  int ishulledge;
  int firstindex, shift;
  int edgenumber, marker;
  int index = 0, index1 = 0, index2 = 0;
  int t1ver;
  int i;

  // For -o2 option.
  point *extralist, pp = NULL; 
  int highorderindex = 11;
  int o2index = 0;

  // For -nn option.
  int *tet2edgelist = NULL;
  int tidx;

  if (out == (tetgenio *) NULL) {
    strcpy(edgefilename, b->outfilename);
    strcat(edgefilename, ".edge");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", edgefilename);
    } else {
      printf("Writing edges.\n");
    }
  }

  if (meshedges == 0l) {
    if (nonconvex) {
      numberedges();  // Count the edges.
    } else {
      // Use Euler's characteristic to get the numbe of edges.
      // It states V - E + F - C = 1, hence E = V + F - C - 1.
      long tsize = tetrahedrons->items - hullsize;
      long fsize = (tsize * 4l + hullsize) / 2l;
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + fsize - tsize - 1;
    }
  }
  meshhulledges = 0l; // It will be counted.

  if (out == (tetgenio *) NULL) {
    outfile = fopen(edgefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", edgefilename);
      terminatetetgen(this, 1);
    }
    // Write the number of edges, boundary markers (0 or 1).
    fprintf(outfile, "%ld  %d\n", meshedges, !b->nobound);
  } else {
    // Allocate memory for 'edgelist'.
    out->numberofedges = meshedges;
    out->edgelist = new int[meshedges * 2];
    if (out->edgelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) { // -o2 switch
      out->o2edgelist = new int[meshedges];
    }
    if (!b->nobound) {
      out->edgemarkerlist = new int[meshedges];
    }
    if (b->neighout > 1) { // '-nn' switch.
      out->edge2tetlist = new int[meshedges];
    }
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-edge map.
	long tsize = tetrahedrons->items - hullsize;
    tet2edgelist = new int[tsize * 6];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift (reduce) the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  edgenumber = firstindex; // in->firstnumber;
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Count the number of Voronoi faces. 
    worktet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      worktet.ver = edge2ver[i];
      ishulledge = 0;
      fnext(worktet, spintet);
      do {
        if (!ishulltet(spintet)) {
          if (elemindex(spintet.tet) < elemindex(worktet.tet)) break;
        } else {
          ishulledge = 1;
        }
        fnextself(spintet);
      } while (spintet.tet != worktet.tet);
      if (spintet.tet == worktet.tet) {
        // Found a new edge.
        if (ishulledge) meshhulledges++;
        torg = org(worktet);
        tdest = dest(worktet);
        if (b->order == 2) { // -o2
          // Get the extra vertex on this edge.
          extralist = (point *) worktet.tet[highorderindex];
          pp = extralist[ver2edge[worktet.ver]];
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "%5d   %4d  %4d", edgenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d", pointmark(pp) - shift);
          }
        } else {
          // Output three vertices of this face;
          out->edgelist[index++] = pointmark(torg) - shift;
          out->edgelist[index++] = pointmark(tdest) - shift;
          if (b->order == 2) { // -o2
            out->o2edgelist[o2index++] = pointmark(pp) - shift;
          }
        }
        if (!b->nobound) {
          if (b->plc || b->refine) {
            // Check if the edge is a segment.
            tsspivot1(worktet, checkseg);
            if (checkseg.sh != NULL) {
              marker = shellmark(checkseg);
            } else {
              marker = 0;  // It's not a segment.
            }
          } else {
            // Mark it if it is a hull edge.
            marker = ishulledge ? 1 : 0;
          }
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", marker);
          } else {
            out->edgemarkerlist[index1++] = marker;
          }
        }
        if (b->neighout > 1) { // '-nn' switch.
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", elemindex(tetloop.tet));
          } else {
            out->edge2tetlist[index2++] = elemindex(tetloop.tet);
          }
		  // Fill the tetrahedron-to-edge map.
		  spintet = worktet;
		  while (1) {
		    if (!ishulltet(spintet)) {
			  tidx = elemindex(spintet.tet) - firstindex;
			  tet2edgelist[tidx * 6 + ver2edge[spintet.ver]] = edgenumber;
			}
		    fnextself(spintet);
			if (spintet.tet == worktet.tet) break;
		  }
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "\n");
        }
        edgenumber++;
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    long tsize = tetrahedrons->items - hullsize;

    if (b->facesout) { // -f option
      // Build the face-to-edge map (use the tet-to-edge map).
	  long fsize = (tsize * 4l + hullsize) / 2l;
	  int *face2edgelist = new int[fsize * 3];

	  tetrahedrons->traversalinit();
      tetloop.tet = tetrahedrontraverse();
      int facenumber = 0; // firstindex; // in->firstnumber;
	  while (tetloop.tet != (tetrahedron *) NULL) {
	    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
		  fsym(tetloop, spintet);
		  if (ishulltet(spintet) || 
              (elemindex(tetloop.tet) < elemindex(spintet.tet))) {
            // The three edges of this face are ordered such that the
			//    first edge is opposite to the first vertex of this face
			//    that appears in the .face file, and so on.
			tidx = elemindex(tetloop.tet) - firstindex; 
			worktet = tetloop;
            for (i = 0; i < 3; i++) {
			  enextself(worktet); // The edge opposite to vertex i.
			  int eidx = tet2edgelist[tidx * 6 + ver2edge[worktet.ver]];
			  face2edgelist[facenumber * 3 + i] = eidx;
			}
		    facenumber++;
		  }
		}
	    tetloop.tet = tetrahedrontraverse();
	  }

	  // Output the face-to-edge map.
	  if (out == (tetgenio *) NULL) {
	    strcpy(edgefilename, b->outfilename);
        strcat(edgefilename, ".f2e");
      }
	  if (!b->quiet) {
        if (out == (tetgenio *) NULL) {
          printf("Writing %s.\n", edgefilename);
        } else {
          printf("Writing face-to-edge map.\n");
        }
      }
	  if (out == (tetgenio *) NULL) {
	    outfile = fopen(edgefilename, "w");
	    for (tidx = 0; tidx < fsize; tidx++) { // Re-use `tidx'
	      i = tidx * 3;
		  fprintf(outfile, "%4d  %d %d %d\n", tidx + in->firstnumber,
		          face2edgelist[i], face2edgelist[i+1], face2edgelist[i+2]);
	    }
	    fclose(outfile);
	    delete [] face2edgelist;
	  } else {
	    // Simply copy the address of the list to the output.
	    out->face2edgelist = face2edgelist;
      }
    } // if (b->facesout)

    // Output the tetrahedron-to-edge map.
	if (out == (tetgenio *) NULL) {
	  strcpy(edgefilename, b->outfilename);
      strcat(edgefilename, ".t2e");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", edgefilename);
      } else {
        printf("Writing tetrahedron-to-edge map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
	  outfile = fopen(edgefilename, "w");
	  for (tidx = 0; tidx < tsize; tidx++) {
	    i = tidx * 6;
		fprintf(outfile, "%4d  %d %d %d %d %d %d\n", tidx + in->firstnumber,
		        tet2edgelist[i], tet2edgelist[i+1], tet2edgelist[i+2],  
				tet2edgelist[i+3], tet2edgelist[i+4], tet2edgelist[i+5]);
	  }
	  fclose(outfile);
	  delete [] tet2edgelist;
	} else {
	  // Simply copy the address of the list to the output.
	  out->tet2edgelist = tet2edgelist;
    }
  }
}